

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

int expandvals(char *cmdp,char *valp,char *bp)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  char cVar8;
  char *pcVar9;
  vhead vVar10;
  undefined1 local_1d8 [8];
  char contbuf [128];
  char varbuf [128];
  char argbuf [128];
  long local_50;
  char *errstr;
  char *local_40;
  int local_34;
  
  pcVar6 = skipwhite(cmdp);
  pcVar9 = varbuf + 0x78;
  uVar7 = strlcpy(pcVar9,pcVar6,0x80);
  if (uVar7 < 0x80) {
    if (varbuf[0x78] != '\0') {
      bVar2 = false;
      bVar4 = false;
      bVar3 = false;
      local_40 = valp;
      pcVar6 = pcVar9;
      cVar8 = varbuf[0x78];
      do {
        if (pcVar6[1] == '\0') {
          bVar4 = true;
        }
        if (cVar8 != ' ') {
          if (cVar8 == '\"') {
            bVar2 = !bVar2;
          }
          if (bVar3) {
            pcVar9 = pcVar6;
          }
          bVar3 = false;
        }
        if (!bVar3 && (bVar4 || !bVar2 && cVar8 == ' ')) {
          if (cVar8 == ' ') {
            *pcVar6 = '\0';
          }
          contbuf[0x78] = '\0';
          local_1d8[0] = 0;
          iVar5 = doregex("[\"]+.*[\"]+",pcVar9);
          if (iVar5 == 0) {
            if (varhead.slh_first != (varentry *)0x0) {
              errstr = pcVar6 + 1;
              vVar10 = varhead;
              do {
                iVar5 = strcmp(pcVar9,(vVar10.slh_first)->v_name);
                if (iVar5 == 0) {
                  pcVar1 = contbuf + 0x78;
                  strlcpy(pcVar1,(vVar10.slh_first)->v_buf,0x80);
                  strlcat(pcVar1," ",0x80);
                  *pcVar6 = ' ';
                  strlcpy(local_1d8,errstr,0x80);
                  strlcat(pcVar1,local_1d8,0x80);
                  varbuf[0x78] = ' ';
                  varbuf[0x79] = '\0';
                  pcVar9 = varbuf + 0x78;
                  strlcat(pcVar9,pcVar1,0x80);
                  valp = local_40;
                  pcVar6 = pcVar9;
                  goto LAB_00121d38;
                }
                vVar10.slh_first = ((vVar10.slh_first)->entry).sle_next;
              } while (vVar10.slh_first != (varentry *)0x0);
            }
            strtonum(pcVar9,0,0x7fffffff,&local_50);
            valp = local_40;
            if (local_50 != 0) {
              iVar5 = dobeep_msgs("Var not found:",pcVar9);
              return iVar5;
            }
          }
          if (((*valp != '\0') && (uVar7 = strlcat(valp," ",0x80), 0x7f < uVar7)) ||
             (uVar7 = strlcat(valp,pcVar9,0x80), 0x7f < uVar7)) {
            pcVar9 = "strlcat error";
            goto LAB_00121bc5;
          }
          if (bVar4) break;
          *pcVar6 = ' ';
LAB_00121d38:
          bVar4 = false;
          bVar3 = true;
        }
        cVar8 = pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while (cVar8 != '\0');
    }
    local_34 = 1;
  }
  else {
    pcVar9 = "strlcpy error";
LAB_00121bc5:
    local_34 = dobeep_msg(pcVar9);
  }
  return local_34;
}

Assistant:

static int
expandvals(char *cmdp, char *valp, char *bp)
{
	char	 argbuf[BUFSIZE];
	char	 contbuf[BUFSIZE], varbuf[BUFSIZE];
	char	*argp, *endp, *p, *v, *s = " ";
	char	*regs;
	int	 spc, cnt;
	int	 sizof, fin, inquote;

	/* now find the first argument */
	p = skipwhite(valp);

	if (strlcpy(argbuf, p, sizeof(argbuf)) >= sizeof(argbuf))
		return (dobeep_msg("strlcpy error"));
	argp = argbuf;
	spc = 1; /* initially fake a space so we find first argument */
	fin = inquote = cnt = spc = 0;

	for (p = argbuf; *p != '\0'; p++) {
		if (*(p + 1) == '\0')
			fin = 1;

		if (*p != ' ') {
			if (*p == '"') {
				if (inquote == 1)
					inquote = 0;
				else
					inquote = 1;
			}
			if (spc == 1)
				argp = p;
			spc = 0;
		}
		if ((*p == ' ' && inquote == 0) || fin) {
			if (spc == 1)
				continue;
			/* terminate arg string */
			if (*p == ' ') {
				*p = '\0';
			}
			endp = p + 1;
			varbuf[0] = '\0';
			contbuf[0] = '\0';
			sizof = sizeof(varbuf);
			v = varbuf;
			regs = "[\"]+.*[\"]+";
       			if (doregex(regs, argp))
				;			/* found quotes */
			else if (isvar(&argp, &v, sizof)) {

				(void)(strlcat(varbuf, " ",
                                    sizof) >= sizof);

				*p = ' ';
				(void)(strlcpy(contbuf, endp,
				    sizeof(contbuf)) >= sizeof(contbuf));

				(void)(strlcat(varbuf, contbuf,
				    sizof) >= sizof);

				argbuf[0] = ' ';
				argbuf[1] = '\0';
				(void)(strlcat(argbuf, varbuf,
				    sizof) >= sizof);

				p = argp = argbuf;
				spc = 1;
				fin = 0;
				continue;
			} else {
				const char *errstr;

				strtonum(argp, 0, INT_MAX, &errstr);
				if (errstr != NULL)
					return (dobeep_msgs("Var not found:",
					    argp));
			}
#ifdef  MGLOG
        mglog_misc("x|%s|%p|%d|\n", bp, defnam, BUFSIZE);
#endif
			if (*bp != '\0') {
				if (strlcat(bp, s, BUFSIZE) >= BUFSIZE)
					return (dobeep_msg("strlcat error"));
			}
			if (strlcat(bp, argp, BUFSIZE) >= BUFSIZE) {
				return (dobeep_msg("strlcat error"));
			}
/*			v1->v_count++;*/

			if (fin)
				break;

			*p = ' ';		/* unterminate arg string */
			spc = 1;
		}
	}
	return (TRUE);
}